

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

int Gli_ManCreateNode(Gli_Man_t *p,Vec_Int_t *vFanins,int nFanouts,word *pGateTruth)

{
  Gli_Obj_t *pObj;
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  uVar2 = vFanins->nSize;
  if (0x10 < (int)uVar2) {
    __assert_fail("Vec_IntSize(vFanins) <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGlitch.c"
                  ,0x175,"int Gli_ManCreateNode(Gli_Man_t *, Vec_Int_t *, int, word *)");
  }
  pObj = (Gli_Obj_t *)(p->pObjData + p->iObjData);
  pObj->Handle = p->iObjData;
  *(uint *)pObj = (uVar2 & 7) << 4 | *(uint *)pObj & 0xf | nFanouts << 7;
  p->iObjData = p->iObjData + (nFanouts & 0x1ffffffU) + (uVar2 & 7) + 8;
  p->nObjs = p->nObjs + 1;
  if (0 < vFanins->nSize) {
    lVar4 = 0;
    do {
      if (p->pObjData == (int *)0x0) break;
      Gli_ObjAddFanin(pObj,(Gli_Obj_t *)(p->pObjData + vFanins->pArray[lVar4]));
      lVar4 = lVar4 + 1;
    } while (lVar4 < vFanins->nSize);
  }
  pObj->pTruth = pGateTruth;
  uVar2 = *(uint *)pObj >> 4 & 7;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    uVar1 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 | (*(uint *)((long)pObj + (long)*(int *)(&pObj->field_0x1c + uVar1 * 4) * -4) >>
                       1 & 1) << ((byte)uVar1 & 0x1f);
      uVar1 = uVar1 + 1;
    } while (uVar2 != uVar1);
  }
  bVar5 = (*(uint *)((long)pGateTruth + (long)((int)uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) != 0;
  *(uint *)pObj = (*(uint *)pObj & 0xfffffff9) + (uint)bVar5 * 4 + (uint)bVar5 * 2;
  return pObj->Handle;
}

Assistant:

int Gli_ManCreateNode( Gli_Man_t * p, Vec_Int_t * vFanins, int nFanouts, word * pGateTruth )
{
    Gli_Obj_t * pObj, * pFanin;
    int i;
    assert( Vec_IntSize(vFanins) <= 16 );
    pObj = Gli_ObjAlloc( p, Vec_IntSize(vFanins), nFanouts );
    Gli_ManForEachEntry( vFanins, p, pFanin, i )
        Gli_ObjAddFanin( pObj, pFanin );
    pObj->pTruth = pGateTruth;
    pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
    return pObj->Handle;
}